

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O2

void __thiscall zmq::session_base_t::write_activated(session_base_t *this,pipe_t *pipe_)

{
  size_type sVar1;
  pipe_t *local_18;
  
  local_18 = pipe_;
  if (this->_pipe == pipe_) {
    if (this->_engine != (i_engine *)0x0) {
      (*this->_engine->_vptr_i_engine[5])();
      return;
    }
  }
  else {
    sVar1 = std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::count
                      (&this->_terminating_pipes,&local_18);
    if (sVar1 != 1) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_terminating_pipes.count (pipe_) == 1",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
              ,0x148);
      fflush(_stderr);
      zmq_abort("_terminating_pipes.count (pipe_) == 1");
    }
  }
  return;
}

Assistant:

void zmq::session_base_t::write_activated (pipe_t *pipe_)
{
    // Skip activating if we're detaching this pipe
    if (_pipe != pipe_) {
        zmq_assert (_terminating_pipes.count (pipe_) == 1);
        return;
    }

    if (_engine)
        _engine->restart_input ();
}